

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_main.c
# Opt level: O0

void failure_start(char *filename,wchar_t line,char *fmt,...)

{
  bool bVar1;
  char in_AL;
  undefined8 in_RCX;
  undefined8 in_R8;
  undefined8 in_R9;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_e8 [24];
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 local_c0;
  undefined8 local_b8;
  undefined8 local_a8;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 local_78;
  undefined8 local_68;
  undefined8 local_58;
  undefined8 local_48;
  undefined1 local_38 [8];
  va_list ap;
  char *fmt_local;
  wchar_t line_local;
  char *filename_local;
  
  if (in_AL != '\0') {
    local_b8 = in_XMM0_Qa;
    local_a8 = in_XMM1_Qa;
    local_98 = in_XMM2_Qa;
    local_88 = in_XMM3_Qa;
    local_78 = in_XMM4_Qa;
    local_68 = in_XMM5_Qa;
    local_58 = in_XMM6_Qa;
    local_48 = in_XMM7_Qa;
  }
  failures = failures + L'\x01';
  failed_filename = filename;
  failed_lines[line].count = failed_lines[line].count + 1;
  if (verbosity == L'\x01') {
    bVar1 = failed_lines[line].count < 2;
  }
  else {
    bVar1 = L'\x01' < verbosity;
  }
  log_console = (wchar_t)bVar1;
  ap[0].overflow_arg_area = local_e8;
  ap[0]._0_8_ = &stack0x00000008;
  local_38._4_4_ = 0x30;
  local_38._0_4_ = 0x18;
  local_d0 = in_RCX;
  local_c8 = in_R8;
  local_c0 = in_R9;
  ap[0].reg_save_area = fmt;
  logprintf("%s:%d: ",filename,(ulong)(uint)line);
  vlogprintf((char *)ap[0].reg_save_area,(__va_list_tag *)local_38);
  logprintf("\n");
  if ((msg != (char *)0x0) && (*msg != '\0')) {
    logprintf("   Description: %s\n",msg);
    msg = (char *)0x0;
  }
  if (verbosity == L'\x01') {
    log_console = L'\0';
  }
  return;
}

Assistant:

static void __LA_PRINTFLIKE(3, 4)
failure_start(const char *filename, int line, const char *fmt, ...)
{
	va_list ap;

	/* Record another failure for this line. */
	++failures;
	failed_filename = filename;
	failed_lines[line].count++;

	/* Determine whether to log header to console. */
	switch (verbosity) {
	case VERBOSITY_LIGHT_REPORT:
		log_console = (failed_lines[line].count < 2);
		break;
	default:
		log_console = (verbosity >= VERBOSITY_FULL);
	}